

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.h
# Opt level: O2

Data * __thiscall
Js::StringBuilder<Memory::ArenaAllocator>::NewSingleChunk
          (StringBuilder<Memory::ArenaAllocator> *this,charcount_t *pBufLengthRequested)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  Data *pDVar6;
  uint uVar7;
  uint uVar8;
  
  uVar7 = *pBufLengthRequested;
  if (0x7ffffffe < uVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0x4d,"(*pBufLengthRequested <= MaxLength)",
                                "*pBufLengthRequested <= MaxLength");
    if (!bVar3) goto LAB_006c44fa;
    *puVar5 = 0;
    uVar7 = *pBufLengthRequested;
  }
  uVar4 = UInt32Math::AddMul<1u,2u>(uVar7);
  uVar1 = ((ulong)uVar4 + 0xf >> 4) * 8 - 1;
  if (uVar1 >> 0x20 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0x59,"(newLength == size_t_newLength)",
                                "newLength == size_t_newLength");
    if (!bVar3) goto LAB_006c44fa;
    *puVar5 = 0;
  }
  uVar7 = (uint)uVar1;
  if ((int)uVar7 < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0x5a,"(newLength <= MaxLength + 1)","newLength <= MaxLength + 1");
    if (!bVar3) goto LAB_006c44fa;
    *puVar5 = 0;
  }
  uVar8 = 0x7ffffffe;
  if ((int)uVar7 < 0x7ffffffe) {
    uVar8 = uVar7;
  }
  if (0x7ffffffe < uVar8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0x61,"(newLength <= MaxLength)","newLength <= MaxLength");
    if (!bVar3) {
LAB_006c44fa:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pDVar6 = (Data *)new<Memory::ArenaAllocator>(0x10,this->alloc,0x35916e,0);
  *(undefined2 *)((long)&pDVar6->u + (ulong)uVar8 * 2) = 0;
  *pBufLengthRequested = uVar8;
  return pDVar6;
}

Assistant:

Data *NewSingleChunk(charcount_t *pBufLengthRequested)
        {
            Assert(*pBufLengthRequested <= MaxLength);

            // Let's just grow the current chunk in place

            CompileAssert(sizeof(charcount_t) == sizeof(uint32));

            //// allocation = (bufLengthRequested+1) * sizeof(char16)
            charcount_t alloc32 = UInt32Math::AddMul< 1, sizeof(char16) >(*pBufLengthRequested);

            size_t allocation = HeapInfo::GetAlignedSize(alloc32);
            size_t size_t_newLength  = allocation / sizeof(char16) - 1;
            charcount_t newLength = (charcount_t)size_t_newLength;
            Assert(newLength == size_t_newLength);
            Assert(newLength <= MaxLength + 1);
            if (newLength == MaxLength + 1)
            {
                // newLength could be MaxLength + 1 because of alignment.
                // In this case alloc size is 2 elements more than newLength (normally 1 elements more for NULL), that's fine.
                newLength = MaxLength;
            }
            Assert(newLength <= MaxLength);

            Data* newChunk = AllocatorNewStructPlus(TAllocator, this->alloc, allocation, Data);
            newChunk->u.single.buffer[newLength] = _u('\0');

            *pBufLengthRequested = newLength;
            return newChunk;
        }